

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

float Search::action_cost_loss(action a,action *act,float *costs,size_t sz)

{
  size_t sVar1;
  vw_exception *this;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (act != (action *)0x0) {
    if (sz != 0) {
      sVar1 = 0;
      do {
        if (act[sVar1] == a) goto LAB_0025fa53;
        sVar1 = sVar1 + 1;
      } while (sz != sVar1);
    }
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (&local_190,"action_cost_loss got action that wasn\'t allowed: ",0x31);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_190);
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/search.cc"
               ,0xb86,&local_1c0);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  sVar1 = (size_t)(a - 1);
LAB_0025fa53:
  return costs[sVar1];
}

Assistant:

float action_cost_loss(action a, const action* act, const float* costs, size_t sz)
{
  if (act == nullptr)
    return costs[a - 1];
  for (size_t i = 0; i < sz; i++)
    if (act[i] == a)
      return costs[i];
  THROW("action_cost_loss got action that wasn't allowed: " << a);
}